

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O0

bool djgt__glTexSubImage3D
               (djg_texture *texture,GLenum target,GLint xoffset,GLint yoffset,GLint zoffset)

{
  GLsizei GVar1;
  GLsizei GVar2;
  PFNGLTEXSUBIMAGE3DPROC p_Var3;
  GLint GVar4;
  bool bVar5;
  int iVar6;
  GLenum GVar7;
  GLenum GVar8;
  GLint local_88;
  bool reset;
  djgt__glpss backup;
  GLint local_58 [2];
  djgt__glpss pus;
  GLint zoffset_local;
  GLint yoffset_local;
  GLint xoffset_local;
  GLenum target_local;
  djg_texture *texture_local;
  
  pus[8] = zoffset;
  memset(local_58,0,0x24);
  pus[6] = 2;
  djgt__get_glpus(&local_88);
  iVar6 = memcmp(local_58,&local_88,0x24);
  if (iVar6 != 0) {
    djgt__set_glpus(local_58);
  }
  GVar4 = pus[8];
  p_Var3 = glad_glTexSubImage3D;
  GVar1 = texture->x;
  GVar2 = texture->y;
  GVar7 = djgt__glformat(texture->comp);
  GVar8 = djgt__gltype(texture->pf);
  (*p_Var3)(target,0,xoffset,yoffset,GVar4,GVar1,GVar2,1,GVar7,GVar8,texture->texels);
  if (iVar6 != 0) {
    djgt__set_glpus(&local_88);
  }
  bVar5 = djgt__validate();
  return bVar5;
}

Assistant:

static bool
djgt__glTexSubImage3D(
    const djg_texture *texture,
    GLenum target,
    GLint xoffset,
    GLint yoffset,
    GLint zoffset
) {
    djgt__glpss pus = {0, 0, 0, 0, 0, 0 ,0, 0, 2};
    djgt__glpss backup;
    bool reset;

    djgt__get_glpus(backup);
    reset = memcmp(pus, backup, sizeof(djgt__glpss)) != 0;
    if (reset) djgt__set_glpus(pus);
    glTexSubImage3D(target,
           /*level*/0,
                    xoffset,
                    yoffset,
                    zoffset,
                    texture->x,
                    texture->y,
           /*depth*/1,
                    djgt__glformat(texture->comp),
                    djgt__gltype(texture->pf),
                    texture->texels);
    if (reset) djgt__set_glpus(backup);

    return djgt__validate();
}